

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseCommaSepArgs
               (int argc,char **argv,char *pattern,
               vector<doctest::String,_std::allocator<doctest::String>_> *res)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  value_type *in_RCX;
  String *in_RDX;
  char **in_RSI;
  undefined4 in_EDI;
  char *pch;
  String filtersString;
  String *in_stack_ffffffffffffff58;
  value_type *__x;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar3;
  char *local_68;
  bool local_1;
  
  String::String((String *)0x10da90);
  String::String((String *)0x10dabf);
  bVar1 = parseOption((int)in_RDX,in_RSI,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58,(String *)0x10dade);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff60);
  String::~String(in_RDX);
  if ((uVar3 & 0x1000000) == 0) {
    local_1 = false;
  }
  else {
    __s = String::c_str(in_stack_ffffffffffffff58);
    local_68 = strtok(__s,",");
    while (local_68 != (char *)0x0) {
      sVar2 = strlen(local_68);
      if (sVar2 != 0) {
        __x = in_RCX;
        String::String(in_RDX,(char *)in_RSI);
        std::vector<doctest::String,_std::allocator<doctest::String>_>::push_back
                  ((vector<doctest::String,_std::allocator<doctest::String>_> *)
                   CONCAT44(in_EDI,uVar3),__x);
        String::~String(in_RDX);
      }
      local_68 = strtok((char *)0x0,",");
    }
    local_1 = true;
  }
  String::~String(in_RDX);
  return local_1;
}

Assistant:

bool parseCommaSepArgs(int argc, const char* const* argv, const char* pattern,
                           std::vector<String>& res) {
        String filtersString;
        if(parseOption(argc, argv, pattern, &filtersString)) {
            // tokenize with "," as a separator
            // cppcheck-suppress strtokCalled
            DOCTEST_CLANG_SUPPRESS_WARNING_WITH_PUSH("-Wdeprecated-declarations")
            auto pch = std::strtok(filtersString.c_str(), ","); // modifies the string
            while(pch != nullptr) {
                if(strlen(pch))
                    res.push_back(pch);
                // uses the strtok() internal state to go to the next token
                // cppcheck-suppress strtokCalled
                pch = std::strtok(nullptr, ",");
            }
            DOCTEST_CLANG_SUPPRESS_WARNING_POP
            return true;
        }
        return false;
    }